

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Upsert * sqlite3UpsertNew(sqlite3 *db,ExprList *pTarget,Expr *pTargetWhere,ExprList *pSet,
                         Expr *pWhere,Upsert *pNext)

{
  CollSeq *in_RCX;
  Vdbe *in_RDX;
  sqlite3_vfs *in_RSI;
  Expr *in_R8;
  Upsert *in_R9;
  Upsert *pNew;
  Upsert *in_stack_ffffffffffffffb8;
  sqlite3 *local_8;
  
  local_8 = (sqlite3 *)
            sqlite3DbMallocZero((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,(u64)in_stack_ffffffffffffffb8);
  if (local_8 == (sqlite3 *)0x0) {
    sqlite3ExprListDelete((sqlite3 *)0x0,(ExprList *)in_stack_ffffffffffffffb8);
    sqlite3ExprDelete(local_8,(Expr *)in_stack_ffffffffffffffb8);
    sqlite3ExprListDelete(local_8,(ExprList *)in_stack_ffffffffffffffb8);
    sqlite3ExprDelete(local_8,(Expr *)in_stack_ffffffffffffffb8);
    sqlite3UpsertDelete(local_8,in_stack_ffffffffffffffb8);
    local_8 = (sqlite3 *)0x0;
  }
  else {
    local_8->pVfs = in_RSI;
    local_8->pVdbe = in_RDX;
    local_8->pDfltColl = in_RCX;
    local_8->mutex = (sqlite3_mutex *)in_R8;
    *(bool *)&local_8->nDb = in_RCX != (CollSeq *)0x0;
    local_8->aDb = (Db *)in_R9;
  }
  return (Upsert *)local_8;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertNew(
  sqlite3 *db,           /* Determines which memory allocator to use */
  ExprList *pTarget,     /* Target argument to ON CONFLICT, or NULL */
  Expr *pTargetWhere,    /* Optional WHERE clause on the target */
  ExprList *pSet,        /* UPDATE columns, or NULL for a DO NOTHING */
  Expr *pWhere,          /* WHERE clause for the ON CONFLICT UPDATE */
  Upsert *pNext          /* Next ON CONFLICT clause in the list */
){
  Upsert *pNew;
  pNew = sqlite3DbMallocZero(db, sizeof(Upsert));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pTarget);
    sqlite3ExprDelete(db, pTargetWhere);
    sqlite3ExprListDelete(db, pSet);
    sqlite3ExprDelete(db, pWhere);
    sqlite3UpsertDelete(db, pNext);
    return 0;
  }else{
    pNew->pUpsertTarget = pTarget;
    pNew->pUpsertTargetWhere = pTargetWhere;
    pNew->pUpsertSet = pSet;
    pNew->pUpsertWhere = pWhere;
    pNew->isDoUpdate = pSet!=0;
    pNew->pNextUpsert = pNext;
  }
  return pNew;
}